

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

entrypoint * dmrC_linearize_symbol(dmr_C *C,symbol *sym)

{
  symbol *psVar1;
  entrypoint *ep;
  basic_block *bb;
  instruction *piVar2;
  symbol *sym_00;
  pseudo_t ppVar3;
  int iVar4;
  undefined1 local_80 [8];
  ptr_list_iter argiter__;
  
  if (sym != (symbol *)0x0) {
    C->L->current_pos = sym->pos;
    psVar1 = (sym->field_14).field_2.ctype.base_type;
    if (((psVar1 != (symbol *)0x0) && (*(char *)psVar1 == '\x05')) &&
       ((psVar1->field_14).field_2.stmt != (statement *)0x0)) {
      ep = (entrypoint *)dmrC_allocator_allocate(&C->L->entrypoint_allocator,0);
      bb = alloc_basic_block(C,ep,sym->pos);
      ep->name = sym;
      (sym->field_14).field_2.ep = ep;
      set_activeblock(C,ep,bb);
      iVar4 = 1;
      piVar2 = alloc_instruction(C,1,0);
      add_one_insn(C,ep,piVar2);
      ep->entry = piVar2;
      ptrlist_concat((ptr_list *)(psVar1->field_14).field_2.arguments,(ptr_list **)&ep->syms);
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_80,(ptr_list *)(psVar1->field_14).field_2.arguments);
      sym_00 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_80);
      while (sym_00 != (symbol *)0x0) {
        argiter__._16_8_ = sym_00;
        symbol_pseudo(C,ep,sym_00);
        ppVar3 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
        piVar2 = ep->entry;
        ppVar3->type = PSEUDO_ARG;
        ppVar3->nr = iVar4;
        (ppVar3->field_5).sym = sym_00;
        ptrlist_add((ptr_list **)&(piVar2->field_6).field_0,ppVar3,&C->ptrlist_allocator);
        linearize_store_gen(C,ep,ppVar3,(access_data *)&argiter__.__nr);
        sym_00 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_80);
        iVar4 = iVar4 + 1;
      }
      ppVar3 = linearize_statement(C,ep,(psVar1->field_14).field_2.stmt);
      if ((ep->active != (basic_block *)0x0) && (iVar4 = dmrC_bb_terminated(ep->active), iVar4 == 0)
         ) {
        psVar1 = (psVar1->field_14).field_2.ctype.base_type;
        piVar2 = alloc_typed_instruction(C,2,psVar1);
        if ((psVar1 != (symbol *)0x0) && (0 < (psVar1->field_14).field_1.normal)) {
          dmrC_use_pseudo(C,piVar2,ppVar3,(pseudo_t *)&(piVar2->field_6).field_0);
        }
        add_one_insn(C,ep,piVar2);
      }
      if (2 < C->verbose) {
        printf("%s(%d): pre dmrC_kill_unreachable_bbs()\n",
               "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
               ,0x91b);
        dmrC_show_entry(C,ep);
      }
      if (C->fdump_linearize != 0) {
        if (C->fdump_linearize == 2) {
          return ep;
        }
        dmrC_show_entry(C,ep);
      }
      dmrC_kill_unreachable_bbs(C,ep);
      if (C->dbg_dead == 0) {
        return ep;
      }
      dmrC_track_pseudo_death(C,ep);
      return ep;
    }
  }
  return (entrypoint *)0x0;
}

Assistant:

struct entrypoint *dmrC_linearize_symbol(struct dmr_C *C, struct symbol *sym)
{
	struct symbol *base_type;

	if (!sym)
		return NULL;
	C->L->current_pos = sym->pos;
	base_type = sym->ctype.base_type;
	if (!base_type)
		return NULL;
	if (base_type->type == SYM_FN)
		return linearize_fn(C, sym, base_type);
	return NULL;
}